

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

int __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::init(basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  key_union *pkVar1;
  long lVar2;
  ulong in_RCX;
  ulong uVar3;
  array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
  *paVar4;
  long in_RDX;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined1 local_30 [8];
  db_inode_reclaimable_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  leaf_reclaimable_ptr r;
  
  pkVar1 = &this->keys;
  uVar5 = in_RCX & 0xff;
  if ((int)in_RCX == 0) {
    lVar7 = in_RDX + 0x40;
    paVar4 = &this->children;
    lVar2 = 0x31;
  }
  else {
    lVar6 = -0x28;
    lVar7 = -0x40;
    uVar3 = 0;
    do {
      *(undefined1 *)((long)(this->children)._M_elems + (uVar3 - 4)) =
           *(undefined1 *)(in_RDX + 0x30 + uVar3);
      (this->children)._M_elems[uVar3].value._M_i.tagged_ptr =
           *(uintptr_t *)(in_RDX + 0x40 + uVar3 * 8);
      uVar3 = uVar3 + 1;
      lVar6 = lVar6 + -8;
      lVar7 = lVar7 + -8;
    } while (uVar5 != uVar3);
    lVar2 = uVar5 + 0x31;
    if (lVar2 == 0x35) goto LAB_00231025;
    pkVar1 = (key_union *)((long)pkVar1 + uVar3);
    paVar4 = (array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
              *)((long)this - lVar6);
    lVar7 = in_RDX - lVar7;
  }
  lVar6 = 0;
  do {
    *(undefined1 *)((long)pkVar1 + lVar6) = *(undefined1 *)(in_RDX + lVar2 + lVar6);
    paVar4->_M_elems[lVar6].value._M_i.tagged_ptr = *(uintptr_t *)(lVar7 + 8 + lVar6 * 8);
    lVar6 = lVar6 + 1;
  } while (4 - uVar5 != lVar6);
LAB_00231025:
  local_30 = (undefined1  [8])ctx;
  reclaim_source_node._M_t.
  super___uniq_ptr_impl<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
  ._M_head_impl =
       (olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
        *)ctx;
  if (this->field_0x20 != '\x04') {
    __assert_fail("this->children_count == basic_inode_4::capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x54d,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::init(db_type &, inode16_type &, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  lVar2 = 0;
  do {
    if (lVar2 == 3) {
      std::
      unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)&reclaim_source_node._M_t.
                        super___uniq_ptr_impl<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                        .
                        super__Head_base<0UL,_unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                   );
      std::
      unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)local_30);
      return extraout_EAX;
    }
    lVar7 = lVar2 + -3;
    lVar6 = lVar2 + -4;
    lVar2 = lVar2 + 1;
  } while (*(byte *)((long)(this->children)._M_elems + lVar6) <=
           *(byte *)((long)(this->children)._M_elems + lVar7));
  __assert_fail("std::is_sorted(keys.byte_array.cbegin(), keys.byte_array.cbegin() + basic_inode_4::capacity)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x550,
                "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::init(db_type &, inode16_type &, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

constexpr void init(db_type &db_instance, inode16_type &source_node,
                      std::uint8_t child_to_delete) {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode16_type>(
            &source_node, db_instance)};
    auto source_keys_itr = source_node.keys.byte_array.cbegin();
    auto keys_itr = keys.byte_array.begin();
    auto source_children_itr = source_node.children.cbegin();
    auto children_itr = children.begin();

    while (source_keys_itr !=
           source_node.keys.byte_array.cbegin() + child_to_delete) {
      *keys_itr++ = *source_keys_itr++;
      *children_itr++ = *source_children_itr++;
    }

    const auto r{ArtPolicy::reclaim_leaf_on_scope_exit(
        source_children_itr->load().template ptr<leaf_type *>(), db_instance)};

    ++source_keys_itr;
    ++source_children_itr;

    while (source_keys_itr !=
           source_node.keys.byte_array.cbegin() + inode16_type::min_size) {
      *keys_itr++ = *source_keys_itr++;
      *children_itr++ = *source_children_itr++;
    }

    UNODB_DETAIL_ASSERT(this->children_count == basic_inode_4::capacity);
    UNODB_DETAIL_ASSERT(
        std::is_sorted(keys.byte_array.cbegin(),
                       keys.byte_array.cbegin() + basic_inode_4::capacity));
  }